

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg6.c
# Opt level: O0

_Bool borg_has_throwable(void)

{
  _Bool _Var1;
  uint local_10;
  wchar_t i;
  
  local_10 = 0;
  while( true ) {
    if ((int)(z_info->pack_size + 0xc + (uint)z_info->quiver_size) <= (int)local_10) {
      return false;
    }
    if (((local_10 != z_info->pack_size) && (borg_items[(int)local_10].iqty != '\0')) &&
       (_Var1 = flag_has_dbg(borg_items[(int)local_10].flags,5,0x25,"borg_items[i].flags",
                             "OF_THROWING"), _Var1)) break;
    local_10 = local_10 + 1;
  }
  return true;
}

Assistant:

static bool borg_has_throwable(void)
{
    int i;
    for (i = 0; i < QUIVER_END; i++) {
        /* it will show wield in the list */
        /* but not if that is the only thing */
        if (i == INVEN_WIELD)
            continue;

        if (!borg_items[i].iqty)
            continue;

        if (of_has(borg_items[i].flags, OF_THROWING))
            return true;
    }
    return false;
}